

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QShaderDescription::BlockVariable*>,long_long>
               (reverse_iterator<QShaderDescription::BlockVariable_*> first,longlong n,
               reverse_iterator<QShaderDescription::BlockVariable_*> d_first)

{
  BlockVariable *pBVar1;
  Data *pDVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  int *piVar7;
  Data *pDVar8;
  BlockVariable *pBVar9;
  BlockVariable *pBVar10;
  ArrayOptions AVar11;
  undefined4 uVar12;
  BlockVariable *pBVar13;
  BlockVariable *pBVar14;
  long in_FS_OFFSET;
  Destructor local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_58.intermediate;
  local_58.end.current = (BlockVariable *)((d_first.current)->name).d.d;
  pBVar13 = local_58.end.current + -n;
  pBVar1 = (BlockVariable *)((first.current)->name).d.d;
  pBVar14 = pBVar1;
  pBVar10 = pBVar13;
  if (pBVar13 < pBVar1) {
    pBVar14 = pBVar13;
    pBVar10 = pBVar1;
  }
  pBVar1 = (BlockVariable *)((d_first.current)->name).d.d;
  while (pBVar1 != pBVar10) {
    pDVar2 = ((first.current)->name).d.d;
    pDVar3 = (Data *)pDVar2[-7].super_QArrayData.alloc;
    pDVar2[-7].super_QArrayData.alloc = 0;
    pBVar1[-1].name.d.d = pDVar3;
    pcVar4 = *(char **)&pDVar2[-6].super_QArrayData;
    pDVar2[-6].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-6].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pBVar1[-1].name.d.ptr = pcVar4;
    qVar5 = pDVar2[-6].super_QArrayData.alloc;
    pDVar2[-6].super_QArrayData.alloc = 0;
    pBVar1[-1].name.d.size = qVar5;
    AVar11.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i =
         pDVar2[-5].super_QArrayData.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>;
    pBVar1[-1].type = (VariableType)pDVar2[-5].super_QArrayData.ref_._q_value;
    pBVar1[-1].offset =
         (int)AVar11.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i;
    pBVar1[-1].size = (int)pDVar2[-5].super_QArrayData.alloc;
    pDVar6 = *(Data **)&pDVar2[-4].super_QArrayData;
    pDVar2[-4].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-4].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pBVar1[-1].arrayDims.d.d = pDVar6;
    piVar7 = (int *)pDVar2[-4].super_QArrayData.alloc;
    pDVar2[-4].super_QArrayData.alloc = 0;
    pBVar1[-1].arrayDims.d.ptr = piVar7;
    qVar5 = *(qsizetype *)&pDVar2[-3].super_QArrayData;
    pDVar2[-3].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-3].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pBVar1[-1].arrayDims.d.size = qVar5;
    uVar12 = *(undefined4 *)((long)&pDVar2[-3].super_QArrayData.alloc + 4);
    pBVar1[-1].arrayStride = *(undefined4 *)&pDVar2[-3].super_QArrayData.alloc;
    pBVar1[-1].matrixStride = uVar12;
    pBVar1[-1].matrixIsRowMajor =
         *(bool *)&pDVar2[-2].super_QArrayData.ref_._q_value.super___atomic_base<int>;
    pDVar8 = (Data *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = 0;
    pBVar1[-1].structMembers.d.d = pDVar8;
    pBVar9 = *(BlockVariable **)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-1].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pBVar1[-1].structMembers.d.ptr = pBVar9;
    qVar5 = pDVar2[-1].super_QArrayData.alloc;
    pDVar2[-1].super_QArrayData.alloc = 0;
    pBVar1[-1].structMembers.d.size = qVar5;
    ((d_first.current)->name).d.d =
         (Data *)&((d_first.current)->name).d.d[-7].super_QArrayData.alloc;
    ((first.current)->name).d.d = (Data *)&((first.current)->name).d.d[-7].super_QArrayData.alloc;
    pBVar1 = (BlockVariable *)((d_first.current)->name).d.d;
  }
  local_58.intermediate.current = (BlockVariable *)((d_first.current)->name).d.d;
  while (pBVar1 = (BlockVariable *)((d_first.current)->name).d.d, pBVar1 != pBVar13) {
    pDVar2 = ((first.current)->name).d.d;
    pDVar3 = pBVar1[-1].name.d.d;
    pBVar1[-1].name.d.d = (Data *)pDVar2[-7].super_QArrayData.alloc;
    pDVar2[-7].super_QArrayData.alloc = (qsizetype)pDVar3;
    pcVar4 = pBVar1[-1].name.d.ptr;
    pBVar1[-1].name.d.ptr = *(char **)&pDVar2[-6].super_QArrayData;
    *(char **)&pDVar2[-6].super_QArrayData = pcVar4;
    qVar5 = pBVar1[-1].name.d.size;
    pBVar1[-1].name.d.size = pDVar2[-6].super_QArrayData.alloc;
    pDVar2[-6].super_QArrayData.alloc = qVar5;
    pBVar1[-1].size = (int)pDVar2[-5].super_QArrayData.alloc;
    AVar11.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
    super_QFlagsStorage<QArrayData::ArrayOption>.i =
         pDVar2[-5].super_QArrayData.flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>;
    pBVar1[-1].type = (VariableType)pDVar2[-5].super_QArrayData.ref_._q_value;
    pBVar1[-1].offset =
         (int)AVar11.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i;
    QArrayDataPointer<int>::operator=
              (&pBVar1[-1].arrayDims.d,(QArrayDataPointer<int> *)(pDVar2 + -4));
    uVar12 = *(undefined4 *)((long)&pDVar2[-3].super_QArrayData.alloc + 4);
    pBVar1[-1].arrayStride = *(undefined4 *)&pDVar2[-3].super_QArrayData.alloc;
    pBVar1[-1].matrixStride = uVar12;
    pBVar1[-1].matrixIsRowMajor =
         *(bool *)&pDVar2[-2].super_QArrayData.ref_._q_value.super___atomic_base<int>;
    QArrayDataPointer<QShaderDescription::BlockVariable>::operator=
              (&pBVar1[-1].structMembers.d,
               (QArrayDataPointer<QShaderDescription::BlockVariable> *)
               &pDVar2[-2].super_QArrayData.alloc);
    ((d_first.current)->name).d.d =
         (Data *)&((d_first.current)->name).d.d[-7].super_QArrayData.alloc;
    ((first.current)->name).d.d = (Data *)&((first.current)->name).d.d[-7].super_QArrayData.alloc;
  }
  local_58.iter = &local_58.end;
  while (pBVar1 = (BlockVariable *)((first.current)->name).d.d, pBVar1 != pBVar14) {
    ((first.current)->name).d.d = (Data *)(pBVar1 + 1);
    QArrayDataPointer<QShaderDescription::BlockVariable>::~QArrayDataPointer
              (&(pBVar1->structMembers).d);
    pDVar6 = (pBVar1->arrayDims).d.d;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((pBVar1->arrayDims).d.d)->super_QArrayData,4,0x10);
      }
    }
    piVar7 = *(int **)&(pBVar1->name).d.d;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pBVar1->name).d.d,1,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QShaderDescription::BlockVariable_*>,_long_long>
  ::Destructor::~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}